

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

Vector<int,_std::allocator<int>_> * __thiscall
NavierStokesBase::fetchBCArray(NavierStokesBase *this,int State_Type,Box *bx,int scomp,int ncomp)

{
  Box *this_00;
  Box *pBVar1;
  StateData *this_01;
  int *piVar2;
  Box *in_RCX;
  long in_RSI;
  Vector<int,_std::allocator<int>_> *in_RDI;
  int in_R9D;
  int m;
  int *b_rec;
  int n;
  Box *domain;
  StateDescriptor *stDesc;
  BCRec bcr;
  Vector<int,_std::allocator<int>_> *bc;
  int dir;
  int *dhi;
  int *dlo;
  int *bxhi;
  int *bxlo;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int local_15c;
  int local_10c;
  int local_fc;
  BCRec local_e4;
  undefined1 local_b9;
  int local_b8;
  Box *local_b0;
  int local_8c;
  int *local_88;
  int *local_80;
  int *local_78;
  int *local_70;
  BCRec *local_68;
  BCRec *local_60;
  Box *local_58;
  Box *local_50;
  int local_44;
  BCRec *local_40;
  int local_34;
  BCRec *local_30;
  BCRec *local_28;
  int local_20;
  int local_1c;
  BCRec *local_18;
  int local_10;
  int local_c;
  BCRec *local_8;
  
  local_b9 = 0;
  local_b8 = in_R9D;
  local_b0 = in_RCX;
  std::allocator<int>::allocator((allocator<int> *)0x7d294f);
  amrex::Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (allocator_type *)0x7d2963);
  std::allocator<int>::~allocator((allocator<int> *)0x7d2972);
  amrex::BCRec::BCRec(&local_e4);
  pBVar1 = amrex::Geometry::Domain((Geometry *)(in_RSI + 0x10));
  for (local_fc = 0; local_fc < local_b8; local_fc = local_fc + 1) {
    this_01 = amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                        ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    amrex::StateData::descriptor(this_01);
    this_00 = local_b0;
    local_60 = amrex::StateDescriptor::getBC
                         ((StateDescriptor *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe8c);
    local_50 = this_00;
    local_68 = &local_e4;
    local_58 = pBVar1;
    local_70 = amrex::Box::loVect(this_00);
    local_78 = amrex::Box::hiVect(local_50);
    local_80 = amrex::Box::loVect(local_58);
    local_88 = amrex::Box::hiVect(local_58);
    for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
      if (local_80[local_8c] < local_70[local_8c]) {
        local_15c = 0;
      }
      else {
        local_40 = local_60;
        local_44 = local_8c;
        local_15c = local_60->bc[local_8c];
      }
      local_1c = local_8c;
      local_18 = local_68;
      local_20 = local_15c;
      local_68->bc[local_8c] = local_15c;
      if (local_78[local_8c] < local_88[local_8c]) {
        in_stack_fffffffffffffe94 = 0;
      }
      else {
        local_30 = local_60;
        local_34 = local_8c;
        in_stack_fffffffffffffe94 = local_60->bc[local_8c + 3];
      }
      local_c = local_8c;
      local_8 = local_68;
      local_68->bc[local_8c + 3] = in_stack_fffffffffffffe94;
      local_10 = in_stack_fffffffffffffe94;
    }
    local_28 = &local_e4;
    for (local_10c = 0; local_10c < 6; local_10c = local_10c + 1) {
      in_stack_fffffffffffffe90 = local_e4.bc[local_10c];
      piVar2 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      *piVar2 = in_stack_fffffffffffffe90;
    }
  }
  return in_RDI;
}

Assistant:

Vector<int>
NavierStokesBase::fetchBCArray (int State_Type, const Box& bx, int scomp, int ncomp)
{
    Vector<int> bc(2*AMREX_SPACEDIM*ncomp);
    BCRec bcr;
    const StateDescriptor* stDesc;
    const Box& domain = geom.Domain();

    for (int n = 0; n < ncomp; n++)
    {
        stDesc=state[State_Type].descriptor();
        setBC(bx,domain,stDesc->getBC(scomp+n),bcr);

        const int* b_rec = bcr.vect();
        for (int m = 0; m < 2*AMREX_SPACEDIM; m++) {
            bc[2*AMREX_SPACEDIM*n + m] = b_rec[m];
        }
    }

    return bc;
}